

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

float TPZMatrix<float>::ReturnNearestValue(float val,TPZVec<float> *Vec,float tol)

{
  float fVar1;
  int64_t i;
  long lVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar4 = *Vec->fStore;
  uVar3 = -(uint)(ABS(val - fVar4) < ABS(tol));
  fVar5 = (float)(~uVar3 & (uint)(val - fVar4) | uVar3 & 0x501502f9);
  for (lVar2 = 1; lVar2 < Vec->fNElements; lVar2 = lVar2 + 1) {
    fVar1 = Vec->fStore[lVar2];
    fVar6 = val - fVar1;
    fVar7 = ABS(fVar6);
    if (ABS(fVar5) <= fVar7 || fVar7 < ABS(tol)) {
      fVar1 = fVar4;
      fVar6 = fVar5;
    }
    fVar4 = fVar1;
    fVar5 = fVar6;
  }
  return fVar4;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}